

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_8::ShapeFunctions
          (ChElementHexaCorot_8 *this,ShapeVector *N,double z0,double z1,double z2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (1.0 - z0) * 0.125;
  dVar2 = dVar1 * (1.0 - z1);
  dVar5 = 1.0 - z2;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[0] =
       dVar5 * dVar2;
  dVar3 = (z0 + 1.0) * 0.125;
  dVar4 = dVar3 * (1.0 - z1);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[1] =
       dVar5 * dVar4;
  dVar3 = dVar3 * (z1 + 1.0);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[2] =
       dVar5 * dVar3;
  dVar1 = dVar1 * (z1 + 1.0);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[3] =
       dVar5 * dVar1;
  dVar5 = z2 + 1.0;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[4] =
       dVar2 * dVar5;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[5] =
       dVar4 * dVar5;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[6] =
       dVar3 * dVar5;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[7] =
       dVar1 * dVar5;
  return;
}

Assistant:

void ChElementHexaCorot_8::ShapeFunctions(ShapeVector& N, double z0, double z1, double z2) {
    double sc = 1. / 8.;
    N(0) = sc * (1 - z0) * (1 - z1) * (1 - z2);
    N(1) = sc * (1 + z0) * (1 - z1) * (1 - z2);
    N(2) = sc * (1 + z0) * (1 + z1) * (1 - z2);
    N(3) = sc * (1 - z0) * (1 + z1) * (1 - z2);
    N(4) = sc * (1 - z0) * (1 - z1) * (1 + z2);
    N(5) = sc * (1 + z0) * (1 - z1) * (1 + z2);
    N(6) = sc * (1 + z0) * (1 + z1) * (1 + z2);
    N(7) = sc * (1 - z0) * (1 + z1) * (1 + z2);
}